

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdb.c
# Opt level: O1

int mdb_env_info(MDB_env *env,MDB_envinfo *arg)

{
  MDB_meta *pMVar1;
  int iVar2;
  uint uVar3;
  
  iVar2 = 0x16;
  if (arg != (MDB_envinfo *)0x0 && env != (MDB_env *)0x0) {
    pMVar1 = env->me_metas[env->me_metas[0]->mm_txnid < env->me_metas[1]->mm_txnid];
    arg->me_mapaddr = pMVar1->mm_address;
    arg->me_last_pgno = pMVar1->mm_last_pg;
    arg->me_last_txnid = pMVar1->mm_txnid;
    arg->me_mapsize = env->me_mapsize;
    arg->me_maxreaders = env->me_maxreaders;
    iVar2 = 0;
    uVar3 = 0;
    if (env->me_txns != (MDB_txninfo *)0x0) {
      uVar3 = (env->me_txns->mt1).mtb.mtb_numreaders;
    }
    arg->me_numreaders = uVar3;
  }
  return iVar2;
}

Assistant:

int ESECT
mdb_env_info(MDB_env *env, MDB_envinfo *arg)
{
	MDB_meta *meta;

	if (env == NULL || arg == NULL)
		return EINVAL;

	meta = mdb_env_pick_meta(env);
	arg->me_mapaddr = meta->mm_address;
	arg->me_last_pgno = meta->mm_last_pg;
	arg->me_last_txnid = meta->mm_txnid;

	arg->me_mapsize = env->me_mapsize;
	arg->me_maxreaders = env->me_maxreaders;
	arg->me_numreaders = env->me_txns ? env->me_txns->mti_numreaders : 0;
	return MDB_SUCCESS;
}